

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uo_json.c
# Opt level: O1

char * uo_json_decode_utf8(char *dst,char *src,size_t src_len)

{
  int iVar1;
  undefined8 in_RAX;
  byte bVar2;
  byte *pbVar3;
  byte *pbVar4;
  byte *pbVar5;
  byte *pbVar6;
  int codepoint;
  undefined8 uStack_38;
  
  if (((src_len < 2) || (*src != '\"')) || (pbVar4 = (byte *)(src + (src_len - 1)), *pbVar4 != 0x22)
     ) {
LAB_00109424:
    dst = (char *)0x0;
  }
  else if (2 < (long)src_len) {
    pbVar5 = (byte *)(src + 1);
    pbVar3 = (byte *)dst;
    uStack_38 = in_RAX;
    do {
      pbVar6 = pbVar5 + 1;
      bVar2 = *pbVar5;
      if (bVar2 != 0x5c) goto LAB_00109348;
      if (pbVar4 <= pbVar6) goto LAB_00109424;
      pbVar6 = pbVar5 + 2;
      bVar2 = pbVar5[1];
      dst = (char *)0x0;
      if (bVar2 < 0x62) {
        if (((bVar2 != 0x22) && (bVar2 != 0x2f)) && (bVar2 != 0x5c)) {
          return (char *)0x0;
        }
        goto LAB_00109348;
      }
      switch(bVar2) {
      case 0x6e:
        bVar2 = 10;
        break;
      case 0x6f:
      case 0x70:
      case 0x71:
      case 0x73:
        goto switchD_001092e7_caseD_6f;
      case 0x72:
        bVar2 = 0xd;
        break;
      case 0x74:
        bVar2 = 9;
        break;
      case 0x75:
        pbVar5 = pbVar5 + 6;
        if (pbVar5 <= pbVar4) {
          iVar1 = __isoc99_sscanf(pbVar6,"%04x",(long)&uStack_38 + 4);
          if (iVar1 == 1) {
            bVar2 = (byte)((ulong)uStack_38 >> 0x20);
            pbVar6 = pbVar5;
            if (uStack_38._4_4_ < 0x80) {
              *pbVar3 = bVar2;
              pbVar3 = pbVar3 + 1;
            }
            else if (uStack_38._4_4_ < 0x800) {
              *pbVar3 = (byte)(uStack_38._4_4_ >> 6) | 0xc0;
              pbVar3[1] = bVar2 & 0x3f | 0x80;
              pbVar3 = pbVar3 + 2;
            }
            else if (uStack_38._4_4_ < 0x10000) {
              *pbVar3 = (byte)(uStack_38._4_4_ >> 0xc) | 0xe0;
              pbVar3[1] = (byte)(uStack_38._4_4_ >> 6) & 0x3f | 0x80;
              pbVar3[2] = bVar2 & 0x3f | 0x80;
              pbVar3 = pbVar3 + 3;
            }
            else if (uStack_38._4_4_ < 0x110000) {
              *pbVar3 = (byte)(uStack_38._4_4_ >> 0x12) | 0xf0;
              pbVar3[1] = (byte)(uStack_38._4_4_ >> 0xc) & 0x3f | 0x80;
              pbVar3[2] = (byte)(uStack_38._4_4_ >> 6) & 0x3f | 0x80;
              pbVar3[3] = bVar2 & 0x3f | 0x80;
              pbVar3 = pbVar3 + 4;
            }
            else {
              pbVar3 = (byte *)0x0;
            }
          }
          dst = (char *)pbVar3;
          pbVar5 = pbVar6;
          if (iVar1 == 1) goto LAB_00109350;
        }
        goto LAB_00109424;
      default:
        if (bVar2 == 0x66) {
          bVar2 = 0xc;
        }
        else {
          if (bVar2 != 0x62) {
            return (char *)0x0;
          }
          bVar2 = 8;
        }
      }
LAB_00109348:
      *pbVar3 = bVar2;
      dst = (char *)(pbVar3 + 1);
      pbVar5 = pbVar6;
LAB_00109350:
      pbVar3 = (byte *)dst;
    } while (pbVar5 < pbVar4);
  }
switchD_001092e7_caseD_6f:
  return dst;
}

Assistant:

char *uo_json_decode_utf8(
    char *dst,
    const char *src,
    size_t src_len)
{
    const char *json_end = src + src_len - 1;
    unsigned char c;

    if (src_len < 2 || *src++ != '\"' || *json_end != '\"')
        return NULL;

    while (src < json_end)
    {
        if ((c = *src++) == '\\')
        {
            if (src >= json_end)
                return NULL;

            switch (*src++)
            {
                case '"':  *dst++ = '"';  break;
                case '\\': *dst++ = '\\'; break;
                case '/':  *dst++ = '/';  break;
                case 'b':  *dst++ = '\b'; break;
                case 'f':  *dst++ = '\f'; break;
                case 'n':  *dst++ = '\n'; break;
                case 'r':  *dst++ = '\r'; break;
                case 't':  *dst++ = '\t'; break;
                
                case 'u':
                {
                    if (src + 4 > json_end)
                        return NULL;

                    int codepoint;
                    if (sscanf(src, "%04x", &codepoint) != 1)
                        return NULL;

                    src += 4;

                    dst = uo_utf8_append(dst, codepoint);
                    break;
                }

                default: return NULL;
            }
            continue;
        }

        *dst++ = c;
    }

    return dst;
}